

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O2

void __thiscall
CQueue::AddToQueue<void(*)(room_index_data*,room_index_data*),room_index_data*&,room_index_data*&>
          (CQueue *this,int nTimer,string *from,string *funcName,
          _func_void_room_index_data_ptr_room_index_data_ptr *func,room_index_data **args,
          room_index_data **args_1)

{
  string_view fmt;
  string_view fmt_00;
  int nTimer_local;
  vector<char_data_*,_std::allocator<char_data_*>_> chs;
  undefined1 local_c8 [40];
  string local_a0 [32];
  vector<char_data_*,_std::allocator<char_data_*>_> local_80;
  function<void()> local_68 [32];
  undefined1 local_48 [24];
  
  nTimer_local = nTimer;
  if (nTimer < 0) {
    local_c8._0_8_ = 2;
    fmt._M_str = "Negative Queue Timer - NumArgs: {}";
    fmt._M_len = 0x22;
    CLogger::Warn<unsigned_long>((CLogger *)&Logger,fmt,(unsigned_long *)local_c8);
  }
  chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c8._0_4_ = nTimer;
  std::__cxx11::string::string((string *)(local_c8 + 8),(string *)from);
  std::__cxx11::string::string(local_a0,(string *)funcName);
  std::vector<char_data_*,_std::allocator<char_data_*>_>::vector(&local_80,&chs);
  local_48._8_8_ = *args;
  local_48._16_8_ = *args_1;
  local_48._0_8_ = func;
  std::function<void()>::
  function<CQueue::AddToQueue<void(*)(room_index_data*,room_index_data*),room_index_data*&,room_index_data*&>(int,std::__cxx11::string,std::__cxx11::string,void(*)(room_index_data*,room_index_data*),room_index_data*&,room_index_data*&)::_lambda()_1_,void>
            (local_68,(anon_class_24_3_3bdf3dc2 *)local_48);
  std::vector<CQueue::queueEntry_t,_std::allocator<CQueue::queueEntry_t>_>::
  emplace_back<CQueue::queueEntry_t>(&this->newQueue,(queueEntry_t *)local_c8);
  queueEntry_t::~queueEntry_t((queueEntry_t *)local_c8);
  fmt_00._M_str = "Add => {} added {} with timer {}";
  fmt_00._M_len = 0x20;
  CLogger::Warn<std::__cxx11::string&,std::__cxx11::string&,int&>
            ((CLogger *)&Logger,fmt_00,from,funcName,&nTimer_local);
  std::_Vector_base<char_data_*,_std::allocator<char_data_*>_>::~_Vector_base
            (&chs.super__Vector_base<char_data_*,_std::allocator<char_data_*>_>);
  return;
}

Assistant:

void AddToQueue(int nTimer, std::string from, std::string funcName, Func func, Args &&...args)
	{
		if(nTimer < 0)
			Logger.Warn("Negative Queue Timer - NumArgs: {}", sizeof...(Args));	

		// print parameters
		//((std::cout << ' ' << args << std::endl), ...);

		// capture parameter pack
		auto tuple = std::tuple<Args...>(args...);
		auto chs = GetCharacterData(tuple);

		// place on queue
		newQueue.push_back({nTimer, from, funcName, chs, [=] () mutable
		{
			std::apply(func, std::forward_as_tuple(std::forward<Args>(args)...));
		}});

		Logger.Warn("Add => {} added {} with timer {}", from, funcName, nTimer);
	}